

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
xLearn::LibsvmParser::Parse(LibsvmParser *this,char *buf,uint64 size,DMatrix *matrix,bool reset)

{
  undefined1 auVar1 [16];
  bool bVar2;
  DMatrix *pDVar3;
  index_t iVar4;
  uint64 uVar5;
  char *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  DMatrix *this_00;
  index_t iVar9;
  float fVar10;
  double dVar11;
  float local_b0;
  Logger local_ac;
  DMatrix *local_a8;
  float local_9c;
  uint64 local_98;
  uint64 local_90;
  string local_88;
  string local_68;
  uint64 local_48;
  char *local_40;
  long local_38;
  
  local_a8 = matrix;
  local_40 = buf;
  if (buf == (char *)0x0) {
    local_ac.severity_ = ERR;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Parse","");
    poVar8 = Logger::Start(ERR,&local_68,0x4c,&local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x4c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"buf",3);
    std::operator<<(poVar8," == NULL \n");
  }
  else {
    if (size != 0) {
      this_00 = (DMatrix *)this;
      if (reset) {
        DMatrix::Reset(matrix);
        this_00 = matrix;
      }
      local_98 = 0;
      local_48 = size;
      do {
        uVar5 = Parser::get_line_from_buffer((Parser *)this_00,line_buf,local_40,local_98,size);
        pDVar3 = local_a8;
        if (uVar5 != 0) {
          local_90 = uVar5;
          DMatrix::AddRow(local_a8);
          iVar9 = pDVar3->row_length;
          fVar10 = -2.0;
          if ((this->super_Parser).has_label_ == true) {
            pcVar6 = strtok(line_buf,(this->super_Parser).splitor_._M_dataplus._M_p);
            dVar11 = atof(pcVar6);
            fVar10 = (float)dVar11;
          }
          iVar9 = iVar9 - 1;
          local_38 = (long)(int)iVar9;
          (local_a8->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[local_38] = fVar10;
          local_b0 = 0.0;
          if ((this->super_Parser).has_label_ == false) {
            pcVar6 = strtok(line_buf,":");
            pcVar7 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
            if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\n')) {
              iVar4 = atoi(pcVar6);
              dVar11 = atof(pcVar7);
              fVar10 = (float)dVar11;
              DMatrix::AddNode(local_a8,iVar9,iVar4,fVar10,0);
              auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),ZEXT416(0));
              local_b0 = auVar1._0_4_;
            }
          }
          local_98 = local_98 + local_90;
          do {
            bVar2 = false;
            pcVar6 = strtok((char *)0x0,":");
            this_00 = (DMatrix *)0x0;
            pcVar7 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
            if (pcVar6 != (char *)0x0) {
              if (*pcVar6 == '\n') {
                bVar2 = false;
              }
              else {
                iVar4 = atoi(pcVar6);
                dVar11 = atof(pcVar7);
                local_9c = (float)dVar11;
                this_00 = local_a8;
                DMatrix::AddNode(local_a8,iVar9,iVar4,local_9c,0);
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)local_b0),ZEXT416((uint)local_9c),
                                         ZEXT416((uint)local_9c));
                local_b0 = auVar1._0_4_;
                bVar2 = true;
              }
            }
          } while (bVar2);
          (local_a8->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[local_38] = 1.0 / local_b0;
          uVar5 = local_90;
          size = local_48;
        }
      } while (uVar5 != 0);
      return;
    }
    local_ac.severity_ = ERR;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Parse","");
    poVar8 = Logger::Start(ERR,&local_68,0x4d,&local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"CHECK_GT failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x4d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"size",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0);
    std::operator<<(poVar8,"\n");
  }
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  Logger::~Logger(&local_ac);
  abort();
}

Assistant:

void LibsvmParser::Parse(char* buf, 
                         uint64 size, 
                         DMatrix& matrix, 
                         bool reset) {
  CHECK_NOTNULL(buf);
  CHECK_GT(size, 0);
  // Clear the data matrix
  if (reset) { 
    matrix.Reset(); 
  }
  // Parse every line
  uint64 pos = 0;
  for (;;) {
    uint64 rd_size = get_line_from_buffer(line_buf, buf, pos, size);
    if (rd_size == 0) break;
    pos += rd_size;
    matrix.AddRow();
    int i = matrix.row_length - 1;
    if (reset == false) {
    }
    // Add Y
    if (has_label_) {  // for training task
      char *y_char = strtok(line_buf, splitor_.c_str());
      matrix.Y[i] = atof(y_char);
    } else {  // for predict task
      matrix.Y[i] = -2;
    }
    // Add features
    real_t norm = 0.0;
    // The first element
    if (!has_label_) {
      char *idx_char = strtok(line_buf, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char != nullptr && *idx_char != '\n') {
        index_t idx = atoi(idx_char);
        real_t value = atof(value_char);
        matrix.AddNode(i, idx, value);
        norm += value*value;
      }
    }
    // The remain elements
    for (;;) {
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char == nullptr || *idx_char == '\n') {
        break;
      }
      index_t idx = atoi(idx_char);
      real_t value = atof(value_char);
      matrix.AddNode(i, idx, value);
      norm += value*value;
    }
    norm = 1.0f / norm;
    matrix.norm[i] = norm;
  }
}